

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::D3MFExporter::writeObjects(D3MFExporter *this)

{
  ostringstream *poVar1;
  pointer *ppuVar2;
  char *__s;
  aiNode *paVar3;
  aiNode *paVar4;
  aiMesh *mesh;
  iterator __position;
  char cVar5;
  uint uVar6;
  ostream *poVar7;
  size_t sVar8;
  ulong uVar9;
  uint local_3c;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_38;
  
  paVar3 = this->mScene->mRootNode;
  if (paVar3 != (aiNode *)0x0) {
    local_3c = 0;
    uVar6 = paVar3->mNumChildren;
    if (uVar6 != 0) {
      poVar1 = &this->mModelOutput;
      local_38 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->mBuildItems;
      do {
        paVar4 = paVar3->mChildren[local_3c];
        if (paVar4 != (aiNode *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"<",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,XmlTag::object_abi_cxx11_,DAT_008dd8b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," id=\"",5);
          __s = (paVar4->mName).data;
          sVar8 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" type=\"model\">",0xf);
          cVar5 = (char)poVar1;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          uVar6 = paVar4->mNumMeshes;
          if (uVar6 != 0) {
            uVar9 = 0;
            do {
              mesh = this->mScene->mMeshes[paVar4->mMeshes[uVar9]];
              if (mesh != (aiMesh *)0x0) {
                writeMesh(this,mesh);
                uVar6 = paVar4->mNumMeshes;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 < uVar6);
          }
          __position._M_current =
               (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->mBuildItems).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_38,__position,&local_3c);
          }
          else {
            *__position._M_current = local_3c;
            ppuVar2 = &(this->mBuildItems).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar2 = *ppuVar2 + 1;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"</",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)poVar1,XmlTag::object_abi_cxx11_,DAT_008dd8b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,">",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
          uVar6 = paVar3->mNumChildren;
        }
        local_3c = local_3c + 1;
      } while (local_3c < uVar6);
    }
  }
  return;
}

Assistant:

void D3MFExporter::writeObjects() {
    if ( nullptr == mScene->mRootNode ) {
        return;
    }

    aiNode *root = mScene->mRootNode;
    for ( unsigned int i = 0; i < root->mNumChildren; ++i ) {
        aiNode *currentNode( root->mChildren[ i ] );
        if ( nullptr == currentNode ) {
            continue;
        }
        mModelOutput << "<" << XmlTag::object << " id=\"" << currentNode->mName.C_Str() << "\" type=\"model\">";
        mModelOutput << std::endl;
        for ( unsigned int j = 0; j < currentNode->mNumMeshes; ++j ) {
            aiMesh *currentMesh = mScene->mMeshes[ currentNode->mMeshes[ j ] ];
            if ( nullptr == currentMesh ) {
                continue;
            }
            writeMesh( currentMesh );
        }
        mBuildItems.push_back( i );

        mModelOutput << "</" << XmlTag::object << ">";
        mModelOutput << std::endl;
    }
}